

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::uploadInputBuffer
          (BufferIoExecutor *this,void **inputPtrs,int numValues)

{
  pointer pVVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  void *dstBasePtr;
  TestError *this_00;
  long lVar5;
  pointer pSVar6;
  long lVar7;
  ulong uVar8;
  long lVar4;
  
  iVar2 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pVVar1 = (this->m_inputLayout).
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 == (this->m_inputLayout).
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar3 = 0;
  }
  else {
    dVar3 = pVVar1->stride;
  }
  if (dVar3 * numValues != 0) {
    (**(code **)(lVar4 + 0x40))(0x90d2,(this->m_inputBuffer).super_ObjectWrapper.m_object);
    dstBasePtr = (void *)(**(code **)(lVar4 + 0xd00))(0x90d2,0,(long)(int)(dVar3 * numValues),2);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glMapBufferRange()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x40a);
    if (dstBasePtr != (void *)0x0) {
      pSVar6 = (this->super_ShaderExecutor).m_inputs.
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->super_ShaderExecutor).m_inputs.
          super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar6) {
        lVar7 = 0x20;
        lVar5 = 0;
        uVar8 = 0;
        do {
          copyToBuffer((VarType *)((long)&(pSVar6->name)._M_dataplus._M_p + lVar7),
                       (VarLayout *)
                       ((long)&((this->m_inputLayout).
                                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                                ._M_impl.super__Vector_impl_data._M_start)->offset + lVar5),
                       numValues,inputPtrs[uVar8],dstBasePtr);
          uVar8 = uVar8 + 1;
          pSVar6 = (this->super_ShaderExecutor).m_inputs.
                   super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0xc;
          lVar7 = lVar7 + 0x38;
        } while (uVar8 < (ulong)(((long)(this->super_ShaderExecutor).m_inputs.
                                        super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >>
                                 3) * 0x6db6db6db6db6db7));
      }
      (**(code **)(lVar4 + 0x1670))(0x90d2);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glUnmapBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x41f);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"mapPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
               ,0x40b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void BufferIoExecutor::uploadInputBuffer (const void* const* inputPtrs, int numValues)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const deUint32			buffer			= *m_inputBuffer;
	const deUint32			inputStride		= getLayoutStride(m_inputLayout);
	const int				inputBufferSize	= inputStride*numValues;

	if (inputBufferSize == 0)
		return; // No inputs

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
	void* mapPtr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, inputBufferSize, GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
	TCU_CHECK(mapPtr);

	try
	{
		DE_ASSERT(m_inputs.size() == m_inputLayout.size());
		for (size_t inputNdx = 0; inputNdx < m_inputs.size(); ++inputNdx)
		{
			const glu::VarType&		varType		= m_inputs[inputNdx].varType;
			const VarLayout&		layout		= m_inputLayout[inputNdx];

			copyToBuffer(varType, layout, numValues, inputPtrs[inputNdx], mapPtr);
		}
	}
	catch (...)
	{
		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		throw;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
}